

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O1

bool __thiscall irr::CIrrDeviceSDL::run(CIrrDeviceSDL *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  array<irr::CIrrDeviceSDL::SKeyMap> *this_00;
  ulong uVar2;
  _SDL_Joystick *p_Var3;
  long *plVar4;
  pointer pwVar5;
  s32 sVar6;
  stringw *psVar7;
  byte bVar8;
  undefined1 uVar9;
  bool bVar10;
  undefined2 uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  pointer pp_Var15;
  EKEY_CODE key;
  ulong uVar16;
  ulong uVar17;
  double __x;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  SKeyMap mp;
  SDL_Event SDL_event;
  undefined4 local_e0 [2];
  undefined8 local_d8;
  undefined8 uStack_d0;
  u32 local_c8;
  uint local_c4;
  SKeyMap local_a8;
  int local_a0 [3];
  char local_94 [4];
  u32 local_90;
  u32 uStack_8c;
  byte bStack_88;
  undefined1 uStack_87;
  undefined2 uStack_86;
  float fStack_84;
  s32 local_80;
  string<char> local_68;
  undefined2 local_38;
  undefined1 local_36;
  
  os::Timer::tick();
  if ((this->super_CIrrDeviceStub).Close == false) {
    this_00 = &this->KeyMap;
    do {
      iVar14 = SDL_PollEvent(local_a0);
      if (iVar14 == 0) break;
      if (local_a0[0] < 0x401) {
        if (local_a0[0] < 0x300) {
          if (local_a0[0] == 0x100) {
            (this->super_CIrrDeviceStub).Close = true;
          }
          else if (local_a0[0] == 0x200) {
            if ((local_94[0] == '\x05') &&
               ((local_90 != this->Width || (uStack_8c != this->Height)))) {
              this->Width = local_90;
              this->Height = uStack_8c;
              plVar4 = *(long **)&(this->super_CIrrDeviceStub).super_IrrlichtDevice.field_0x8;
              if (plVar4 != (long *)0x0) {
                local_68.str._M_dataplus._M_p._0_4_ = local_90;
                local_68.str._M_dataplus._M_p._4_4_ = uStack_8c;
                (**(code **)(*plVar4 + 0x260))(plVar4,&local_68);
              }
            }
LAB_0020d9a6:
            local_e0[0] = 10;
            local_d8 = (stringw *)CONCAT44(uStack_8c,local_90);
            uStack_d0 = CONCAT44(fStack_84,CONCAT22(uStack_86,CONCAT11(uStack_87,bStack_88)));
            goto LAB_0020dc65;
          }
        }
        else if (local_a0[0] - 0x300U < 2) {
          local_a8.SDLKey = uStack_8c;
          core::array<irr::CIrrDeviceSDL::SKeyMap>::sort(this_00);
          key = KEY_UNKNOWN;
          uVar13 = core::array<irr::CIrrDeviceSDL::SKeyMap>::binary_search
                             (this_00,&local_a8,0,
                              (int)((ulong)((long)(this->KeyMap).m_data.
                                                  super__Vector_base<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->KeyMap).m_data.
                                                 super__Vector_base<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                              -1);
          if (uVar13 != 0xffffffff) {
            key = (this_00->m_data).
                  super__Vector_base<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar13].Win32Key;
          }
          if (key == KEY_UNKNOWN) {
            core::string<char>::string(&local_68,local_a8.SDLKey);
            os::Printer::log(__x);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_68.str._M_dataplus._M_p._4_4_,(u32)local_68.str._M_dataplus._M_p)
                != &local_68.str.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_68.str._M_dataplus._M_p._4_4_,
                                       (u32)local_68.str._M_dataplus._M_p),
                              CONCAT44(local_68.str.field_2._M_allocated_capacity._4_4_,
                                       local_68.str.field_2._M_allocated_capacity._0_4_) + 1);
            }
          }
          iVar14 = SDL_IsTextInputActive();
          if (((iVar14 == 0) || (bVar10 = keyIsKnownSpecial(key), bVar10)) ||
             ((bStack_88 & 0xc0) != 0)) {
            local_e0[0] = 2;
            uStack_d0._0_5_ =
                 CONCAT14(((bStack_88 & 0xc0) != 0) << 2 |
                          ((bStack_88 & 3) != 0) * '\x02' |
                          uStack_d0._4_1_ & 0xf8 | local_a0[0] == 0x300,(undefined4)uStack_d0);
            local_d8._4_4_ = key;
            iVar14 = findCharToPassToIrrlicht(local_a8.SDLKey,key);
            local_d8 = (stringw *)CONCAT44(local_d8._4_4_,iVar14);
            goto LAB_0020dc65;
          }
        }
        else if (local_a0[0] == 0x303) {
          local_e0[0] = 3;
          local_d8 = (stringw *)operator_new(0x20);
          (local_d8->str)._M_dataplus._M_p = (pointer)&(local_d8->str).field_2;
          (local_d8->str)._M_string_length = 0;
          (local_d8->str).field_2._M_local_buf[0] = L'\0';
          core::utf8ToWString(local_d8,local_94);
          (*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[0x19])
                    (this,local_e0);
          psVar7 = local_d8;
          if (local_d8 != (stringw *)0x0) {
            pwVar5 = (local_d8->str)._M_dataplus._M_p;
            paVar1 = &(local_d8->str).field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)pwVar5 != paVar1) {
              operator_delete(pwVar5,paVar1->_M_allocated_capacity * 4 + 4);
            }
            operator_delete(psVar7,0x20);
          }
          local_d8 = (stringw *)0x0;
        }
        else if (local_a0[0] == 0x400) {
          uVar17 = SDL_GetModState();
          local_e0[0] = 1;
          local_c4 = 6;
          sVar6 = CONCAT22(uStack_86,CONCAT11(uStack_87,bStack_88));
          local_d8 = (stringw *)CONCAT44(sVar6,uStack_8c);
          this->MouseX = uStack_8c;
          this->MouseY = sVar6;
          this->MouseXRel = (s32)fStack_84;
          this->MouseYRel = local_80;
          local_c8 = this->MouseButtonStates;
          uStack_d0._0_5_ =
               CONCAT14(((uVar17 & 0xc0) != 0) * '\x02' | (uVar17 & 3) != 0 | uStack_d0._4_1_ & 0xfc
                        ,(undefined4)uStack_d0);
          goto LAB_0020dc65;
        }
        goto LAB_0020dc74;
      }
      dVar21 = (double)DAT_0022e050;
      dVar22 = DAT_0022e050._8_8_;
      if (local_a0[0] < 0x701) {
        if (local_a0[0] - 0x401U < 2) {
          uVar17 = SDL_GetModState();
          local_e0[0] = 1;
          local_d8 = (stringw *)
                     CONCAT26(uStack_86,CONCAT15(uStack_87,CONCAT14(bStack_88,uStack_8c)));
          uStack_d0._0_5_ =
               CONCAT14(((uVar17 & 0xc0) != 0) * '\x02' | (uVar17 & 3) != 0 | uStack_d0._4_1_ & 0xfc
                        ,(undefined4)uStack_d0);
          local_c4 = 6;
          if ((local_90 & 0xff) == 3) {
            if (local_a0[0] == 0x401) {
              local_c4 = 1;
              *(byte *)&this->MouseButtonStates = (byte)this->MouseButtonStates | 2;
            }
            else {
              local_c4 = 4;
              *(byte *)&this->MouseButtonStates = (byte)this->MouseButtonStates & 0xfd;
            }
          }
          else if ((local_90 & 0xff) == 2) {
            if (local_a0[0] == 0x401) {
              local_c4 = 2;
              *(byte *)&this->MouseButtonStates = (byte)this->MouseButtonStates | 4;
            }
            else {
              local_c4 = 5;
              *(byte *)&this->MouseButtonStates = (byte)this->MouseButtonStates & 0xfb;
            }
          }
          else if ((char)local_90 == '\x01') {
            if (local_a0[0] == 0x401) {
              local_c4 = 0;
              *(byte *)&this->MouseButtonStates = (byte)this->MouseButtonStates | 1;
            }
            else {
              local_c4 = 3;
              *(byte *)&this->MouseButtonStates = (byte)this->MouseButtonStates & 0xfe;
            }
          }
          local_c8 = this->MouseButtonStates;
          if ((local_c4 != 6) &&
             ((*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[0x19])
                        (this,local_e0), local_c4 < 3)) {
            iVar14 = (*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[0x35])
                               (this,(ulong)local_d8 & 0xffffffff,(ulong)local_d8 >> 0x20);
            if (iVar14 == 3) {
              local_c4 = local_c4 + 0xb;
            }
            else {
              if (iVar14 != 2) goto LAB_0020dc74;
              local_c4 = local_c4 + 8;
            }
            goto LAB_0020dc65;
          }
        }
        else {
          if (local_a0[0] == 0x403) {
            uVar17 = SDL_GetModState();
            local_e0[0] = 1;
            local_c4 = 7;
            uStack_d0._0_5_ =
                 CONCAT14(((uVar17 & 0xc0) != 0) * '\x02' | (uVar17 & 3) != 0 |
                          uStack_d0._4_1_ & 0xfc,local_80);
            local_d8._0_4_ = this->MouseX;
            local_d8._4_4_ = this->MouseY;
            goto LAB_0020dc65;
          }
          if (local_a0[0] == 0x700) {
            local_c4 = 0;
            uVar2._0_4_ = this->Width;
            uVar2._4_4_ = this->Height;
            auVar18._0_8_ = uVar2 & 0xffffffff;
            auVar18._8_4_ = uVar2._4_4_;
            auVar18._12_4_ = 0;
            uStack_d0 = CONCAT44((int)((float)(SUB168(auVar18 | _DAT_0022e050,8) - dVar22) *
                                      fStack_84),
                                 (int)((float)(SUB168(auVar18 | _DAT_0022e050,0) - dVar21) *
                                      (float)CONCAT22(uStack_86,CONCAT11(uStack_87,bStack_88))));
            local_c8 = this->CurrentTouchCount + 1;
            this->CurrentTouchCount = local_c8;
            goto LAB_0020dc61;
          }
        }
      }
      else {
        if (local_a0[0] == 0x701) {
          local_e0[0] = 4;
          local_c4 = 1;
          local_d8 = (stringw *)CONCAT44(uStack_8c,local_90);
          uVar17._0_4_ = this->Width;
          uVar17._4_4_ = this->Height;
          auVar19._0_8_ = uVar17 & 0xffffffff;
          auVar19._8_4_ = uVar17._4_4_;
          auVar19._12_4_ = 0;
          uStack_d0 = CONCAT44((int)((float)(SUB168(auVar19 | _DAT_0022e050,8) - dVar22) * fStack_84
                                    ),(int)((float)(SUB168(auVar19 | _DAT_0022e050,0) - dVar21) *
                                           (float)CONCAT22(uStack_86,CONCAT11(uStack_87,bStack_88)))
                              );
          local_c8 = this->CurrentTouchCount;
          if (0 < (int)local_c8) {
            this->CurrentTouchCount = local_c8 - 1;
          }
        }
        else {
          if (local_a0[0] != 0x702) {
            if (local_a0[0] == 0x8000) goto LAB_0020d9a6;
            goto LAB_0020dc74;
          }
          local_c4 = 2;
          uVar16._0_4_ = this->Width;
          uVar16._4_4_ = this->Height;
          auVar20._0_8_ = uVar16 & 0xffffffff;
          auVar20._8_4_ = uVar16._4_4_;
          auVar20._12_4_ = 0;
          uStack_d0 = CONCAT44((int)((float)(SUB168(auVar20 | _DAT_0022e050,8) - dVar22) * fStack_84
                                    ),(int)((float)(SUB168(auVar20 | _DAT_0022e050,0) - dVar21) *
                                           (float)CONCAT22(uStack_86,CONCAT11(uStack_87,bStack_88)))
                              );
          local_c8 = this->CurrentTouchCount;
LAB_0020dc61:
          local_d8 = (stringw *)CONCAT44(uStack_8c,local_90);
          local_e0[0] = 4;
        }
LAB_0020dc65:
        (*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[0x19])
                  (this,local_e0);
      }
LAB_0020dc74:
      resetReceiveTextInputEvents(this);
    } while ((this->super_CIrrDeviceStub).Close != true);
  }
  SDL_JoystickUpdate();
  local_68.str._M_dataplus._M_p._0_4_ = 8;
  pp_Var15 = (this->Joysticks).m_data.
             super__Vector_base<_SDL_Joystick_*,_std::allocator<_SDL_Joystick_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->Joysticks).m_data.
                          super__Vector_base<_SDL_Joystick_*,_std::allocator<_SDL_Joystick_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pp_Var15) >> 3) != 0) {
    uVar17 = 0;
    do {
      p_Var3 = pp_Var15[uVar17];
      if (p_Var3 != (_SDL_Joystick *)0x0) {
        iVar12 = SDL_JoystickNumButtons(p_Var3);
        iVar14 = 0x20;
        if (iVar12 < 0x20) {
          iVar14 = iVar12;
        }
        local_68.str._M_string_length._0_4_ = 0;
        if (0 < iVar12) {
          iVar12 = 0;
          do {
            bVar8 = SDL_JoystickGetButton(p_Var3,iVar12);
            local_68.str._M_string_length._0_4_ =
                 (uint)local_68.str._M_string_length | (uint)bVar8 << ((byte)iVar12 & 0x1f);
            iVar12 = iVar12 + 1;
          } while (iVar14 != iVar12);
        }
        uVar13 = SDL_JoystickNumAxes(p_Var3);
        local_68.str._M_string_length._4_4_ = 0;
        local_68.str.field_2._M_allocated_capacity._0_4_ = 0;
        local_68.str.field_2._M_allocated_capacity._4_4_ = 0;
        if (0 < (int)uVar13) {
          if (0x11 < (int)uVar13) {
            uVar13 = 0x12;
          }
          uVar16 = 0;
          do {
            uVar11 = SDL_JoystickGetAxis(p_Var3,uVar16 & 0xffffffff);
            *(undefined2 *)((long)&local_68.str._M_string_length + uVar16 * 2 + 4) = uVar11;
            uVar16 = uVar16 + 1;
          } while (uVar13 != uVar16);
        }
        iVar14 = SDL_JoystickNumHats(p_Var3);
        if (iVar14 < 1) {
switchD_0020d6f4_caseD_5:
          local_38 = 0xffff;
        }
        else {
          uVar9 = SDL_JoystickGetHat(p_Var3,0);
          switch(uVar9) {
          case 1:
            local_38 = 0;
            break;
          case 2:
            local_38 = 9000;
            break;
          case 3:
            local_38 = 0x1194;
            break;
          case 4:
            local_38 = 18000;
            break;
          default:
            goto switchD_0020d6f4_caseD_5;
          case 6:
            local_38 = 0x34bc;
            break;
          case 8:
            local_38 = 27000;
            break;
          case 9:
            local_38 = 0x7b0c;
            break;
          case 0xc:
            local_38 = 0x57e4;
          }
        }
        local_36 = (undefined1)uVar17;
        (*(this->super_CIrrDeviceStub).super_IrrlichtDevice._vptr_IrrlichtDevice[0x19])(this);
      }
      uVar17 = uVar17 + 1;
      pp_Var15 = (this->Joysticks).m_data.
                 super__Vector_base<_SDL_Joystick_*,_std::allocator<_SDL_Joystick_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar17 < ((ulong)((long)(this->Joysticks).m_data.
                                     super__Vector_base<_SDL_Joystick_*,_std::allocator<_SDL_Joystick_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var15) >>
                       3 & 0xffffffff));
  }
  return (bool)((this->super_CIrrDeviceStub).Close ^ 1);
}

Assistant:

bool CIrrDeviceSDL::run()
{
	os::Timer::tick();

	SEvent irrevent;
	SDL_Event SDL_event;

	while (!Close && SDL_PollEvent(&SDL_event)) {
		// os::Printer::log("event: ", core::stringc((int)SDL_event.type).c_str(),   ELL_INFORMATION);	// just for debugging

		switch (SDL_event.type) {
		case SDL_MOUSEMOTION: {
			SDL_Keymod keymod = SDL_GetModState();

			irrevent.EventType = irr::EET_MOUSE_INPUT_EVENT;
			irrevent.MouseInput.Event = irr::EMIE_MOUSE_MOVED;
			MouseX = irrevent.MouseInput.X = SDL_event.motion.x;
			MouseY = irrevent.MouseInput.Y = SDL_event.motion.y;
			MouseXRel = SDL_event.motion.xrel;
			MouseYRel = SDL_event.motion.yrel;
			irrevent.MouseInput.ButtonStates = MouseButtonStates;
			irrevent.MouseInput.Shift = (keymod & KMOD_SHIFT) != 0;
			irrevent.MouseInput.Control = (keymod & KMOD_CTRL) != 0;

			postEventFromUser(irrevent);
			break;
		}
		case SDL_MOUSEWHEEL: {
			SDL_Keymod keymod = SDL_GetModState();

			irrevent.EventType = irr::EET_MOUSE_INPUT_EVENT;
			irrevent.MouseInput.Event = irr::EMIE_MOUSE_WHEEL;
#if SDL_VERSION_ATLEAST(2, 0, 18)
			irrevent.MouseInput.Wheel = SDL_event.wheel.preciseY;
#else
			irrevent.MouseInput.Wheel = SDL_event.wheel.y;
#endif
			irrevent.MouseInput.Shift = (keymod & KMOD_SHIFT) != 0;
			irrevent.MouseInput.Control = (keymod & KMOD_CTRL) != 0;
			irrevent.MouseInput.X = MouseX;
			irrevent.MouseInput.Y = MouseY;

			postEventFromUser(irrevent);
			break;
		}
		case SDL_MOUSEBUTTONDOWN:
		case SDL_MOUSEBUTTONUP: {
			SDL_Keymod keymod = SDL_GetModState();

			irrevent.EventType = irr::EET_MOUSE_INPUT_EVENT;
			irrevent.MouseInput.X = SDL_event.button.x;
			irrevent.MouseInput.Y = SDL_event.button.y;
			irrevent.MouseInput.Shift = (keymod & KMOD_SHIFT) != 0;
			irrevent.MouseInput.Control = (keymod & KMOD_CTRL) != 0;

			irrevent.MouseInput.Event = irr::EMIE_MOUSE_MOVED;

#ifdef _IRR_EMSCRIPTEN_PLATFORM_
			// Handle mouselocking in emscripten in Windowed mode.
			// In fullscreen SDL will handle it.
			// The behavior we want windowed is - when the canvas was clicked then
			// we will lock the mouse-pointer if it should be invisible.
			// For security reasons this will be delayed until the next mouse-up event.
			// We do not pass on this event as we don't want the activation click to do anything.
			if (SDL_event.type == SDL_MOUSEBUTTONDOWN && !isFullscreen()) {
				EmscriptenPointerlockChangeEvent pointerlockStatus; // let's hope that test is not expensive ...
				if (emscripten_get_pointerlock_status(&pointerlockStatus) == EMSCRIPTEN_RESULT_SUCCESS) {
					if (CursorControl->isVisible() && pointerlockStatus.isActive) {
						emscripten_exit_pointerlock();
						return !Close;
					} else if (!CursorControl->isVisible() && !pointerlockStatus.isActive) {
						emscripten_request_pointerlock(0, true);
						return !Close;
					}
				}
			}
#endif

			switch (SDL_event.button.button) {
			case SDL_BUTTON_LEFT:
				if (SDL_event.type == SDL_MOUSEBUTTONDOWN) {
					irrevent.MouseInput.Event = irr::EMIE_LMOUSE_PRESSED_DOWN;
					MouseButtonStates |= irr::EMBSM_LEFT;
				} else {
					irrevent.MouseInput.Event = irr::EMIE_LMOUSE_LEFT_UP;
					MouseButtonStates &= ~irr::EMBSM_LEFT;
				}
				break;

			case SDL_BUTTON_RIGHT:
				if (SDL_event.type == SDL_MOUSEBUTTONDOWN) {
					irrevent.MouseInput.Event = irr::EMIE_RMOUSE_PRESSED_DOWN;
					MouseButtonStates |= irr::EMBSM_RIGHT;
				} else {
					irrevent.MouseInput.Event = irr::EMIE_RMOUSE_LEFT_UP;
					MouseButtonStates &= ~irr::EMBSM_RIGHT;
				}
				break;

			case SDL_BUTTON_MIDDLE:
				if (SDL_event.type == SDL_MOUSEBUTTONDOWN) {
					irrevent.MouseInput.Event = irr::EMIE_MMOUSE_PRESSED_DOWN;
					MouseButtonStates |= irr::EMBSM_MIDDLE;
				} else {
					irrevent.MouseInput.Event = irr::EMIE_MMOUSE_LEFT_UP;
					MouseButtonStates &= ~irr::EMBSM_MIDDLE;
				}
				break;
			}

			irrevent.MouseInput.ButtonStates = MouseButtonStates;

			if (irrevent.MouseInput.Event != irr::EMIE_MOUSE_MOVED) {
				postEventFromUser(irrevent);

				if (irrevent.MouseInput.Event >= EMIE_LMOUSE_PRESSED_DOWN && irrevent.MouseInput.Event <= EMIE_MMOUSE_PRESSED_DOWN) {
					u32 clicks = checkSuccessiveClicks(irrevent.MouseInput.X, irrevent.MouseInput.Y, irrevent.MouseInput.Event);
					if (clicks == 2) {
						irrevent.MouseInput.Event = (EMOUSE_INPUT_EVENT)(EMIE_LMOUSE_DOUBLE_CLICK + irrevent.MouseInput.Event - EMIE_LMOUSE_PRESSED_DOWN);
						postEventFromUser(irrevent);
					} else if (clicks == 3) {
						irrevent.MouseInput.Event = (EMOUSE_INPUT_EVENT)(EMIE_LMOUSE_TRIPLE_CLICK + irrevent.MouseInput.Event - EMIE_LMOUSE_PRESSED_DOWN);
						postEventFromUser(irrevent);
					}
				}
			}
			break;
		}

		case SDL_TEXTINPUT: {
			irrevent.EventType = irr::EET_STRING_INPUT_EVENT;
			irrevent.StringInput.Str = new core::stringw();
			irr::core::utf8ToWString(*irrevent.StringInput.Str, SDL_event.text.text);
			postEventFromUser(irrevent);
			delete irrevent.StringInput.Str;
			irrevent.StringInput.Str = NULL;
		} break;

		case SDL_KEYDOWN:
		case SDL_KEYUP: {
			SKeyMap mp;
			mp.SDLKey = SDL_event.key.keysym.sym;
			s32 idx = KeyMap.binary_search(mp);

			EKEY_CODE key;
			if (idx == -1)
				key = (EKEY_CODE)0;
			else
				key = (EKEY_CODE)KeyMap[idx].Win32Key;

			if (key == (EKEY_CODE)0)
				os::Printer::log("keycode not mapped", core::stringc(mp.SDLKey), ELL_DEBUG);

			// Make sure to only input special characters if something is in focus, as SDL_TEXTINPUT handles normal unicode already
			if (SDL_IsTextInputActive() && !keyIsKnownSpecial(key) && (SDL_event.key.keysym.mod & KMOD_CTRL) == 0)
				break;

			irrevent.EventType = irr::EET_KEY_INPUT_EVENT;
			irrevent.KeyInput.Key = key;
			irrevent.KeyInput.PressedDown = (SDL_event.type == SDL_KEYDOWN);
			irrevent.KeyInput.Shift = (SDL_event.key.keysym.mod & KMOD_SHIFT) != 0;
			irrevent.KeyInput.Control = (SDL_event.key.keysym.mod & KMOD_CTRL) != 0;
			irrevent.KeyInput.Char = findCharToPassToIrrlicht(mp.SDLKey, key);
			postEventFromUser(irrevent);
		} break;

		case SDL_QUIT:
			Close = true;
			break;

		case SDL_WINDOWEVENT:
			switch (SDL_event.window.event) {
			case SDL_WINDOWEVENT_RESIZED:
				if ((SDL_event.window.data1 != (int)Width) || (SDL_event.window.data2 != (int)Height)) {
					Width = SDL_event.window.data1;
					Height = SDL_event.window.data2;
					if (VideoDriver)
						VideoDriver->OnResize(core::dimension2d<u32>(Width, Height));
				}
				break;
			}

		case SDL_USEREVENT:
			irrevent.EventType = irr::EET_USER_EVENT;
			irrevent.UserEvent.UserData1 = reinterpret_cast<uintptr_t>(SDL_event.user.data1);
			irrevent.UserEvent.UserData2 = reinterpret_cast<uintptr_t>(SDL_event.user.data2);

			postEventFromUser(irrevent);
			break;

		case SDL_FINGERDOWN:
			irrevent.EventType = EET_TOUCH_INPUT_EVENT;
			irrevent.TouchInput.Event = ETIE_PRESSED_DOWN;
			irrevent.TouchInput.ID = SDL_event.tfinger.fingerId;
			irrevent.TouchInput.X = SDL_event.tfinger.x * Width;
			irrevent.TouchInput.Y = SDL_event.tfinger.y * Height;
			CurrentTouchCount++;
			irrevent.TouchInput.touchedCount = CurrentTouchCount;

			postEventFromUser(irrevent);
			break;

		case SDL_FINGERMOTION:
			irrevent.EventType = EET_TOUCH_INPUT_EVENT;
			irrevent.TouchInput.Event = ETIE_MOVED;
			irrevent.TouchInput.ID = SDL_event.tfinger.fingerId;
			irrevent.TouchInput.X = SDL_event.tfinger.x * Width;
			irrevent.TouchInput.Y = SDL_event.tfinger.y * Height;
			irrevent.TouchInput.touchedCount = CurrentTouchCount;

			postEventFromUser(irrevent);
			break;

		case SDL_FINGERUP:
			irrevent.EventType = EET_TOUCH_INPUT_EVENT;
			irrevent.TouchInput.Event = ETIE_LEFT_UP;
			irrevent.TouchInput.ID = SDL_event.tfinger.fingerId;
			irrevent.TouchInput.X = SDL_event.tfinger.x * Width;
			irrevent.TouchInput.Y = SDL_event.tfinger.y * Height;
			// To match Android behavior, still count the pointer that was
			// just released.
			irrevent.TouchInput.touchedCount = CurrentTouchCount;
			if (CurrentTouchCount > 0) {
				CurrentTouchCount--;
			}

			postEventFromUser(irrevent);
			break;

		default:
			break;
		} // end switch
		resetReceiveTextInputEvents();
	} // end while

#if defined(_IRR_COMPILE_WITH_JOYSTICK_EVENTS_)
	// TODO: Check if the multiple open/close calls are too expensive, then
	// open/close in the constructor/destructor instead

	// update joystick states manually
	SDL_JoystickUpdate();
	// we'll always send joystick input events...
	SEvent joyevent;
	joyevent.EventType = EET_JOYSTICK_INPUT_EVENT;
	for (u32 i = 0; i < Joysticks.size(); ++i) {
		SDL_Joystick *joystick = Joysticks[i];
		if (joystick) {
			int j;
			// query all buttons
			const int numButtons = core::min_(SDL_JoystickNumButtons(joystick), 32);
			joyevent.JoystickEvent.ButtonStates = 0;
			for (j = 0; j < numButtons; ++j)
				joyevent.JoystickEvent.ButtonStates |= (SDL_JoystickGetButton(joystick, j) << j);

			// query all axes, already in correct range
			const int numAxes = core::min_(SDL_JoystickNumAxes(joystick), (int)SEvent::SJoystickEvent::NUMBER_OF_AXES);
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_X] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_Y] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_Z] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_R] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_U] = 0;
			joyevent.JoystickEvent.Axis[SEvent::SJoystickEvent::AXIS_V] = 0;
			for (j = 0; j < numAxes; ++j)
				joyevent.JoystickEvent.Axis[j] = SDL_JoystickGetAxis(joystick, j);

			// we can only query one hat, SDL only supports 8 directions
			if (SDL_JoystickNumHats(joystick) > 0) {
				switch (SDL_JoystickGetHat(joystick, 0)) {
				case SDL_HAT_UP:
					joyevent.JoystickEvent.POV = 0;
					break;
				case SDL_HAT_RIGHTUP:
					joyevent.JoystickEvent.POV = 4500;
					break;
				case SDL_HAT_RIGHT:
					joyevent.JoystickEvent.POV = 9000;
					break;
				case SDL_HAT_RIGHTDOWN:
					joyevent.JoystickEvent.POV = 13500;
					break;
				case SDL_HAT_DOWN:
					joyevent.JoystickEvent.POV = 18000;
					break;
				case SDL_HAT_LEFTDOWN:
					joyevent.JoystickEvent.POV = 22500;
					break;
				case SDL_HAT_LEFT:
					joyevent.JoystickEvent.POV = 27000;
					break;
				case SDL_HAT_LEFTUP:
					joyevent.JoystickEvent.POV = 31500;
					break;
				case SDL_HAT_CENTERED:
				default:
					joyevent.JoystickEvent.POV = 65535;
					break;
				}
			} else {
				joyevent.JoystickEvent.POV = 65535;
			}

			// we map the number directly
			joyevent.JoystickEvent.Joystick = static_cast<u8>(i);
			// now post the event
			postEventFromUser(joyevent);
			// and close the joystick
		}
	}
#endif
	return !Close;
}